

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  LogLevel level;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  const_reference pvVar8;
  char *pcVar9;
  ostream *poVar10;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  bool bVar11;
  string local_438;
  string local_418;
  cmListFileBacktrace local_3f8;
  allocator<char> local_3e1;
  string local_3e0;
  byte local_3ba;
  byte local_3b9;
  undefined1 local_3b8 [6];
  bool haveBinaryDir;
  bool haveSourceDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  undefined1 local_378 [8];
  string kdevError;
  cmGlobalGenerator *gen;
  string local_348;
  undefined1 local_328 [8];
  string value_2;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  string value_1;
  string local_290;
  allocator<char> local_269;
  string local_268;
  undefined1 local_248 [8];
  string value;
  string file;
  string local_200;
  string local_1e0;
  LogLevel local_1c0;
  allocator<char> local_1b9;
  LogLevel logLevel;
  string local_198;
  undefined1 local_178 [8];
  string path_2;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  undefined1 local_e8 [8];
  string path_1;
  allocator<char> local_a1;
  string local_a0;
  uint local_80;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string path;
  string *arg;
  uint i;
  bool havePlatform;
  bool haveToolset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar2 = false;
  bVar1 = false;
  arg._0_4_ = 1;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 <= (uint)arg) {
      GetHomeDirectory_abi_cxx11_(this);
      bVar3 = std::__cxx11::string::empty();
      local_3b9 = (bVar3 ^ 0xff) & 1;
      GetHomeOutputDirectory_abi_cxx11_(this);
      bVar3 = std::__cxx11::string::empty();
      local_3ba = (bVar3 ^ 0xff) & 1;
      collapse = extraout_DL;
      if (((this->CurrentWorkingMode == NORMAL_MODE) && ((local_3b9 & 1) == 0)) && (local_3ba == 0))
      {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e0,
                   "No source or binary directory provided. Both will be assumed to be the same as the current working directory, but note that this warning will become a fatal error in future CMake releases."
                   ,&local_3e1);
        local_3f8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3f8.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_3f8);
        IssueMessage(this,WARNING,&local_3e0,&local_3f8);
        cmListFileBacktrace::~cmListFileBacktrace(&local_3f8);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::allocator<char>::~allocator(&local_3e1);
        collapse = extraout_DL_00;
      }
      if ((local_3b9 & 1) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_418,(SystemTools *)0x1,(bool)collapse);
        SetHomeDirectory(this,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        collapse = extraout_DL_01;
      }
      if ((local_3ba & 1) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_438,(SystemTools *)0x1,(bool)collapse);
        SetHomeOutputDirectory(this,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
      }
      return;
    }
    path.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,(ulong)(uint)arg);
    lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x89dc8a);
    if ((lVar6 == 0) ||
       (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8acfdd), lVar6 == 0)) {
      std::__cxx11::string::substr((ulong)local_48,path.field_2._8_8_);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
LAB_002ed54a:
        cmsys::SystemTools::CollapseFullPath
                  ((string *)((long)&path_1.field_2 + 8),(string *)local_48);
        std::__cxx11::string::operator=
                  ((string *)local_48,(string *)(path_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(path_1.field_2._M_local_buf + 8));
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
        SetHomeDirectory(this,(string *)local_48);
        local_80 = 0;
      }
      else {
        arg._0_4_ = (uint)arg + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if ((uint)arg < sVar5) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg);
          std::__cxx11::string::operator=((string *)local_48,(string *)pvVar8);
          pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
          if (*pcVar9 != '-') goto LAB_002ed54a;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a0,"No source directory specified for -S",&local_a1);
          cmSystemTools::Error(&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          local_80 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"No source directory specified for -S",&local_69);
          cmSystemTools::Error(&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::allocator<char>::~allocator(&local_69);
          local_80 = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_48);
joined_r0x002ed5bb:
      if (local_80 != 0) {
        return;
      }
    }
    else {
      lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8acfe0);
      if (lVar6 == 0) goto LAB_002ee8ab;
      lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad004);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)local_e8,path.field_2._8_8_);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
LAB_002ed802:
          cmsys::SystemTools::CollapseFullPath
                    ((string *)((long)&path_2.field_2 + 8),(string *)local_e8);
          std::__cxx11::string::operator=
                    ((string *)local_e8,(string *)(path_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_e8);
          SetHomeOutputDirectory(this,(string *)local_e8);
          local_80 = 0;
        }
        else {
          arg._0_4_ = (uint)arg + 1;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if ((uint)arg < sVar5) {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg);
            std::__cxx11::string::operator=((string *)local_e8,(string *)pvVar8);
            pcVar9 = (char *)std::__cxx11::string::operator[]((ulong)local_e8);
            if (*pcVar9 != '-') goto LAB_002ed802;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"No build directory specified for -B",&local_131);
            cmSystemTools::Error(&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            std::allocator<char>::~allocator(&local_131);
            local_80 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_108,"No build directory specified for -B",&local_109);
            cmSystemTools::Error(&local_108);
            std::__cxx11::string::~string((string *)&local_108);
            std::allocator<char>::~allocator(&local_109);
            local_80 = 1;
          }
        }
        std::__cxx11::string::~string((string *)local_e8);
        goto joined_r0x002ed5bb;
      }
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (((ulong)(uint)arg < sVar5 - 2) &&
         (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad007), lVar6 == 0)) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)((uint)arg + 1));
        std::__cxx11::string::operator=((string *)&this->CheckBuildSystemArgument,(string *)pvVar8);
        arg._0_4_ = (uint)arg + 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,(ulong)(uint)arg);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        iVar4 = atoi(pcVar9);
        this->ClearBuildSystem = 0 < iVar4;
      }
      else {
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (((ulong)(uint)arg < sVar5 - 1) &&
           (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad01c), lVar6 == 0)) {
          arg._0_4_ = (uint)arg + 1;
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)(uint)arg);
          std::__cxx11::string::operator=((string *)&this->CheckStampFile,(string *)pvVar8);
        }
        else {
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (((ulong)(uint)arg < sVar5 - 1) &&
             (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad02f), lVar6 == 0))
          {
            arg._0_4_ = (uint)arg + 1;
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)(uint)arg);
            std::__cxx11::string::operator=((string *)&this->CheckStampList,(string *)pvVar8);
          }
          else {
            lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8bd652);
            if (lVar6 == 0) {
              lVar6 = std::__cxx11::string::size();
              if (lVar6 == 2) {
                arg._0_4_ = (uint)arg + 1;
              }
            }
            else {
              lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ace73);
              if (lVar6 == 0) {
                lVar6 = std::__cxx11::string::size();
                if (lVar6 == 2) {
                  arg._0_4_ = (uint)arg + 1;
                }
              }
              else {
                lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x898230);
                if (lVar6 == 0) {
                  lVar6 = std::__cxx11::string::size();
                  if (lVar6 == 2) {
                    arg._0_4_ = (uint)arg + 1;
                  }
                }
                else {
                  lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x89825d);
                  if (lVar6 == 0) {
                    arg._0_4_ = (uint)arg + 1;
                  }
                  else {
                    lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8acef8);
                    if (lVar6 == 0) {
                      arg._0_4_ = (uint)arg + 1;
                    }
                    else {
                      lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ace25);
                      if (lVar6 != 0) {
                        lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad042);
                        if (lVar6 == 0) {
                          std::__cxx11::string::substr((ulong)local_178,path.field_2._8_8_);
                          cmsys::SystemTools::CollapseFullPath(&local_198,(string *)local_178);
                          std::__cxx11::string::operator=((string *)local_178,(string *)&local_198);
                          std::__cxx11::string::~string((string *)&local_198);
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_178);
                          std::__cxx11::string::operator=
                                    ((string *)&this->GraphVizFile,(string *)local_178);
                          uVar7 = std::__cxx11::string::empty();
                          bVar11 = (uVar7 & 1) != 0;
                          if (bVar11) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&logLevel,"No file specified for --graphviz",
                                       &local_1b9);
                            cmSystemTools::Error((string *)&logLevel);
                            std::__cxx11::string::~string((string *)&logLevel);
                            std::allocator<char>::~allocator(&local_1b9);
                          }
                          local_80 = (uint)bVar11;
                          std::__cxx11::string::~string((string *)local_178);
                          goto joined_r0x002ed5bb;
                        }
                        lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad06f);
                        if (lVar6 == 0) {
                          std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                          DebugTryCompileOn(this);
                        }
                        else {
                          lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad097);
                          if (lVar6 == 0) {
                            std::operator<<((ostream *)&std::cout,"Running with debug output on.\n")
                            ;
                            SetDebugOutputOn(this,true);
                          }
                          else {
                            lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0x8ad0c5);
                            if (lVar6 == 0) {
                              std::__cxx11::string::substr((ulong)&local_1e0,path.field_2._8_8_);
                              level = StringToLogLevel(&local_1e0);
                              std::__cxx11::string::~string((string *)&local_1e0);
                              local_1c0 = level;
                              if (level == LOG_UNDEFINED) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_200,
                                           "Invalid level specified for --loglevel",
                                           (allocator<char> *)(file.field_2._M_local_buf + 0xf));
                                cmSystemTools::Error(&local_200);
                                std::__cxx11::string::~string((string *)&local_200);
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(file.field_2._M_local_buf + 0xf));
                                return;
                              }
                              SetLogLevel(this,level);
                            }
                            else {
                              lVar6 = std::__cxx11::string::find
                                                ((char *)path.field_2._8_8_,0x8981ec);
                              if (lVar6 == 0) {
                                std::operator<<((ostream *)&std::cout,
                                                "Running with expanded trace output on.\n");
                                SetTrace(this,true);
                                SetTraceExpand(this,true);
                              }
                              else {
                                lVar6 = std::__cxx11::string::find
                                                  ((char *)path.field_2._8_8_,0x8ad120);
                                if (lVar6 == 0) {
                                  std::__cxx11::string::substr
                                            ((ulong)(&value.field_2._M_allocated_capacity + 1),
                                             path.field_2._8_8_);
                                  cmsys::SystemTools::ConvertToUnixSlashes
                                            ((string *)(&value.field_2._M_allocated_capacity + 1));
                                  AddTraceSource(this,(string *)((long)&value.field_2 + 8));
                                  SetTrace(this,true);
                                  std::__cxx11::string::~string
                                            ((string *)(value.field_2._M_local_buf + 8));
                                }
                                else {
                                  lVar6 = std::__cxx11::string::find
                                                    ((char *)path.field_2._8_8_,0x8981b8);
                                  if (lVar6 == 0) {
                                    std::operator<<((ostream *)&std::cout,
                                                    "Running with trace output on.\n");
                                    SetTrace(this,true);
                                    SetTraceExpand(this,false);
                                  }
                                  else {
                                    lVar6 = std::__cxx11::string::find
                                                      ((char *)path.field_2._8_8_,0x8ad14f);
                                    if (lVar6 == 0) {
                                      std::operator<<((ostream *)&std::cout,
                                                      "Warn about uninitialized values.\n");
                                      SetWarnUninitialized(this,true);
                                    }
                                    else {
                                      lVar6 = std::__cxx11::string::find
                                                        ((char *)path.field_2._8_8_,0x8ad186);
                                      if (lVar6 == 0) {
                                        std::operator<<((ostream *)&std::cout,
                                                        "Finding unused variables.\n");
                                        SetWarnUnused(this,true);
                                      }
                                      else {
                                        lVar6 = std::__cxx11::string::find
                                                          ((char *)path.field_2._8_8_,0x8ad1b4);
                                        if (lVar6 == 0) {
                                          poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                        
                                                  "Not searching for unused variables given on the "
                                                  );
                                          std::operator<<(poVar10,"command line.\n");
                                          SetWarnUnusedCli(this,false);
                                        }
                                        else {
                                          lVar6 = std::__cxx11::string::find
                                                            ((char *)path.field_2._8_8_,0x8ad209);
                                          if (lVar6 != 0) {
                                            lVar6 = std::__cxx11::string::find
                                                              ((char *)path.field_2._8_8_,0x8ad288);
                                            if (lVar6 != 0) {
                                              lVar6 = std::__cxx11::string::find
                                                                ((char *)path.field_2._8_8_,0x8ad2c4
                                                                );
                                              if (lVar6 != 0) {
                                                lVar6 = std::__cxx11::string::find
                                                                  ((char *)path.field_2._8_8_,
                                                                   0x8ad302);
                                                if (lVar6 != 0) {
                                                  SetDirectoriesFromFile
                                                            (this,(string *)path.field_2._8_8_);
                                                  goto LAB_002ee8ab;
                                                }
                                                std::__cxx11::string::substr
                                                          ((ulong)local_328,path.field_2._8_8_);
                                                uVar7 = std::__cxx11::string::empty();
                                                if ((uVar7 & 1) == 0) {
LAB_002ee6d6:
                                                  kdevError.field_2._8_8_ =
                                                       CreateGlobalGenerator
                                                                 (this,(string *)local_328);
                                                  if ((cmGlobalGenerator *)kdevError.field_2._8_8_
                                                      == (cmGlobalGenerator *)0x0) {
                                                    std::__cxx11::string::string
                                                              ((string *)local_378);
                                                    lVar6 = std::__cxx11::string::find
                                                                      (local_328,0x8ad305);
                                                    if (lVar6 != -1) {
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_378,
                                                                                                                                  
                                                  "\nThe KDevelop3 generator is not supported anymore."
                                                  );
                                                  }
                                                  std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3b8,"Could not create named generator ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_328);
                                                  std::operator+(&local_398,
                                                                 (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_3b8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_378);
                                                  cmSystemTools::Error(&local_398);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_398);
                                                  std::__cxx11::string::~string((string *)local_3b8)
                                                  ;
                                                  PrintGeneratorList(this);
                                                  local_80 = 1;
                                                  std::__cxx11::string::~string((string *)local_378)
                                                  ;
                                                  }
                                                  else {
                                                    SetGlobalGenerator(this,(cmGlobalGenerator *)
                                                                            kdevError.field_2._8_8_)
                                                    ;
                                                    local_80 = 0;
                                                  }
                                                }
                                                else {
                                                  arg._0_4_ = (uint)arg + 1;
                                                  sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar5) {
                                                    pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_328,(string *)pvVar8);
                                                  goto LAB_002ee6d6;
                                                  }
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_348,
                                                             "No generator specified for -G",
                                                             (allocator<char> *)((long)&gen + 7));
                                                  cmSystemTools::Error(&local_348);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_348);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)((long)&gen + 7));
                                                  PrintGeneratorList(this);
                                                  local_80 = 1;
                                                }
                                                std::__cxx11::string::~string((string *)local_328);
                                                if (local_80 != 0) {
                                                  return;
                                                }
                                                goto LAB_002ee8ab;
                                              }
                                              std::__cxx11::string::substr
                                                        ((ulong)local_2b8,path.field_2._8_8_);
                                              uVar7 = std::__cxx11::string::empty();
                                              if ((uVar7 & 1) == 0) {
LAB_002ee494:
                                                if (bVar2) {
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_300,
                                                             "Multiple -T options not allowed",
                                                             (allocator<char> *)
                                                             (value_2.field_2._M_local_buf + 0xf));
                                                  cmSystemTools::Error(&local_300);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_300);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             (value_2.field_2._M_local_buf + 0xf));
                                                  local_80 = 1;
                                                }
                                                else {
                                                  SetGeneratorToolset(this,(string *)local_2b8);
                                                  bVar2 = true;
                                                  local_80 = 0;
                                                }
                                              }
                                              else {
                                                arg._0_4_ = (uint)arg + 1;
                                                sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                if ((uint)arg < sVar5) {
                                                  pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_2b8,(string *)pvVar8);
                                                  goto LAB_002ee494;
                                                }
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_2d8,
                                                           "No toolset specified for -T",&local_2d9)
                                                ;
                                                cmSystemTools::Error(&local_2d8);
                                                std::__cxx11::string::~string((string *)&local_2d8);
                                                std::allocator<char>::~allocator(&local_2d9);
                                                local_80 = 1;
                                              }
                                              std::__cxx11::string::~string((string *)local_2b8);
                                              goto joined_r0x002ed5bb;
                                            }
                                            std::__cxx11::string::substr
                                                      ((ulong)local_248,path.field_2._8_8_);
                                            uVar7 = std::__cxx11::string::empty();
                                            if ((uVar7 & 1) == 0) {
LAB_002ee260:
                                              if (bVar1) {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_290,
                                                           "Multiple -A options not allowed",
                                                           (allocator<char> *)
                                                           (value_1.field_2._M_local_buf + 0xf));
                                                cmSystemTools::Error(&local_290);
                                                std::__cxx11::string::~string((string *)&local_290);
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           (value_1.field_2._M_local_buf + 0xf));
                                                local_80 = 1;
                                              }
                                              else {
                                                SetGeneratorPlatform(this,(string *)local_248);
                                                bVar1 = true;
                                                local_80 = 0;
                                              }
                                            }
                                            else {
                                              arg._0_4_ = (uint)arg + 1;
                                              sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                              if ((uint)arg < sVar5) {
                                                pvVar8 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                std::__cxx11::string::operator=
                                                          ((string *)local_248,(string *)pvVar8);
                                                goto LAB_002ee260;
                                              }
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_268,
                                                         "No platform specified for -A",&local_269);
                                              cmSystemTools::Error(&local_268);
                                              std::__cxx11::string::~string((string *)&local_268);
                                              std::allocator<char>::~allocator(&local_269);
                                              local_80 = 1;
                                            }
                                            std::__cxx11::string::~string((string *)local_248);
                                            goto joined_r0x002ed5bb;
                                          }
                                          poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                        
                                                  "Also check system files when warning about unused and "
                                                  );
                                          std::operator<<(poVar10,"uninitialized variables.\n");
                                          SetCheckSystemVars(this,true);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_002ee8ab:
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GeneratorInstance,"");
      if ((this->GeneratorPlatformSet & 1U) == 0) {
        std::__cxx11::string::operator=((string *)&this->GeneratorPlatform,"");
      }
      if ((this->GeneratorToolsetSet & 1U) == 0) {
        std::__cxx11::string::operator=((string *)&this->GeneratorToolset,"");
      }
    }
    arg._0_4_ = (uint)arg + 1;
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args)
{
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0 || arg.find("-S", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No source directory specified for -S");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      std::string path = arg.substr(2);
      if (path.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
        path = args[i];
        if (path[0] == '-') {
          cmSystemTools::Error("No build directory specified for -B");
          return;
        }
      }

      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
      // in case '-D var=val' is given, also skip the next
      // in case '-Dvar=val' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
      // in case '-U var' is given, also skip the next
      // in case '-Uvar' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
      // in case '-C path' is given, also skip the next
      // in case '-Cpath' is given, don't skip the next
      if (arg.size() == 2) {
        ++i;
      }
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
        return;
      }
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--loglevel=", 0) == 0) {
      const auto logLevel =
        StringToLogLevel(arg.substr(sizeof("--loglevel=") - 1));
      if (logLevel == LogLevel::LOG_UNDEFINED) {
        cmSystemTools::Error("Invalid level specified for --loglevel");
        return;
      }
      this->SetLogLevel(logLevel);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->SetGeneratorPlatform(value);
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->SetGeneratorToolset(value);
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        std::string kdevError;
        if (value.find("KDevelop3", 0) != std::string::npos) {
          kdevError = "\nThe KDevelop3 generator is not supported anymore.";
        }

        cmSystemTools::Error("Could not create named generator " + value +
                             kdevError);
        this->PrintGeneratorList();
        return;
      }
      this->SetGlobalGenerator(gen);
    }
    // no option assume it is the path to the source or an existing build
    else {
      this->SetDirectoriesFromFile(arg);
    }
    // Empty instance, platform and toolset if only a generator is specified
    if (this->GlobalGenerator) {
      this->GeneratorInstance = "";
      if (!this->GeneratorPlatformSet) {
        this->GeneratorPlatform = "";
      }
      if (!this->GeneratorToolsetSet) {
        this->GeneratorToolset = "";
      }
    }
  }